

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

void __thiscall
duckdb::MultiFileReader::GetPartitionData
          (MultiFileReader *this,ClientContext *context,MultiFileReaderBindData *bind_data,
          MultiFileReaderData *reader_data,
          optional_ptr<duckdb::MultiFileReaderGlobalState,_true> global_state,
          OperatorPartitionInfo *partition_info,OperatorPartitionData *partition_data)

{
  idx_t *piVar1;
  InternalException *this_00;
  pointer pMVar2;
  idx_t *piVar3;
  allocator local_49;
  string local_48;
  
  piVar3 = (partition_info->partition_columns).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (partition_info->partition_columns).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (piVar3 == piVar1) {
      return;
    }
    pMVar2 = (reader_data->constant_map).constant_map.
             super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
             .
             super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (pMVar2 == (reader_data->constant_map).constant_map.
                    super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                    .
                    super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_48,
                   "MultiFileReader::GetPartitionData - did not find constant for the given partition"
                   ,&local_49);
        InternalException::InternalException(this_00,&local_48);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((pMVar2->column_idx).index == *piVar3) break;
      pMVar2 = pMVar2 + 1;
    }
    ::std::vector<duckdb::ColumnPartitionData,std::allocator<duckdb::ColumnPartitionData>>::
    emplace_back<duckdb::Value_const&>
              ((vector<duckdb::ColumnPartitionData,std::allocator<duckdb::ColumnPartitionData>> *)
               &partition_data->partition_data,&pMVar2->value);
    piVar3 = piVar3 + 1;
  } while( true );
}

Assistant:

void MultiFileReader::GetPartitionData(ClientContext &context, const MultiFileReaderBindData &bind_data,
                                       const MultiFileReaderData &reader_data,
                                       optional_ptr<MultiFileReaderGlobalState> global_state,
                                       const OperatorPartitionInfo &partition_info,
                                       OperatorPartitionData &partition_data) {
	for (idx_t col : partition_info.partition_columns) {
		bool found_constant = false;
		for (auto &constant : reader_data.constant_map) {
			if (constant.column_idx.GetIndex() == col) {
				found_constant = true;
				partition_data.partition_data.emplace_back(constant.value);
				break;
			}
		}
		if (!found_constant) {
			throw InternalException(
			    "MultiFileReader::GetPartitionData - did not find constant for the given partition");
		}
	}
}